

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

void osqp_set_default_settings(OSQPSettings *settings)

{
  settings->rho = 0.1;
  settings->sigma = 1e-06;
  settings->scaling = 10;
  settings->adaptive_rho = 1;
  settings->adaptive_rho_interval = 0;
  settings->adaptive_rho_tolerance = 5.0;
  settings->adaptive_rho_fraction = 0.4;
  settings->max_iter = 4000;
  settings->eps_abs = 0.001;
  settings->eps_rel = 0.001;
  settings->eps_prim_inf = 0.0001;
  settings->eps_dual_inf = 0.0001;
  settings->alpha = 1.6;
  settings->linsys_solver = QDLDL_SOLVER;
  settings->delta = 1e-06;
  settings->polish = 0;
  settings->polish_refine_iter = 3;
  settings->verbose = 1;
  settings->scaled_termination = 0;
  settings->check_termination = 0x19;
  settings->warm_start = 1;
  settings->time_limit = 0.0;
  return;
}

Assistant:

void osqp_set_default_settings(OSQPSettings *settings) {

  settings->rho           = (c_float)RHO;            /* ADMM step */
  settings->sigma         = (c_float)SIGMA;          /* ADMM step */
  settings->scaling = SCALING;                       /* heuristic problem scaling */
#if EMBEDDED != 1
  settings->adaptive_rho           = ADAPTIVE_RHO;
  settings->adaptive_rho_interval  = ADAPTIVE_RHO_INTERVAL;
  settings->adaptive_rho_tolerance = (c_float)ADAPTIVE_RHO_TOLERANCE;

# ifdef PROFILING
  settings->adaptive_rho_fraction = (c_float)ADAPTIVE_RHO_FRACTION;
# endif /* ifdef PROFILING */
#endif  /* if EMBEDDED != 1 */

  settings->max_iter      = MAX_ITER;                /* maximum iterations to
                                                        take */
  settings->eps_abs       = (c_float)EPS_ABS;        /* absolute convergence
                                                        tolerance */
  settings->eps_rel       = (c_float)EPS_REL;        /* relative convergence
                                                        tolerance */
  settings->eps_prim_inf  = (c_float)EPS_PRIM_INF;   /* primal infeasibility
                                                        tolerance */
  settings->eps_dual_inf  = (c_float)EPS_DUAL_INF;   /* dual infeasibility
                                                        tolerance */
  settings->alpha         = (c_float)ALPHA;          /* relaxation parameter */
  settings->linsys_solver = LINSYS_SOLVER;           /* relaxation parameter */

#ifndef EMBEDDED
  settings->delta              = DELTA;              /* regularization parameter
                                                        for polish */
  settings->polish             = POLISH;             /* ADMM solution polish: 1
                                                      */
  settings->polish_refine_iter = POLISH_REFINE_ITER; /* iterative refinement
                                                        steps in polish */
  settings->verbose            = VERBOSE;            /* print output */
#endif /* ifndef EMBEDDED */

  settings->scaled_termination = SCALED_TERMINATION; /* Evaluate scaled
                                                        termination criteria*/
  settings->check_termination  = CHECK_TERMINATION;  /* Interval for evaluating
                                                        termination criteria */
  settings->warm_start         = WARM_START;         /* warm starting */

#ifdef PROFILING
  settings->time_limit = TIME_LIMIT;
#endif /* ifdef PROFILING */
}